

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall ParserContext::ParserContext(ParserContext *this,ContextCache *ccache)

{
  undefined1 auVar1 [16];
  int iVar2;
  ContextDatabase *pCVar3;
  ulong uVar4;
  uintm *puVar5;
  ContextCache *ccache_local;
  ParserContext *this_local;
  
  std::vector<ContextSet,_std::allocator<ContextSet>_>::vector(&this->contextcommit);
  Address::Address(&this->addr);
  Address::Address(&this->naddr);
  Address::Address(&this->calladdr);
  std::vector<ConstructState,_std::allocator<ConstructState>_>::vector(&this->state);
  this->parsestate = 0;
  this->contcache = ccache;
  if (ccache == (ContextCache *)0x0) {
    this->contextsize = 0;
    this->context = (uintm *)0x0;
  }
  else {
    pCVar3 = ContextCache::getDatabase(ccache);
    iVar2 = (*pCVar3->_vptr_ContextDatabase[8])();
    this->contextsize = iVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->contextsize;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    puVar5 = (uintm *)operator_new__(uVar4);
    this->context = puVar5;
  }
  return;
}

Assistant:

ParserContext::ParserContext(ContextCache *ccache)

{
  parsestate = 0;
  contcache = ccache;
  if (ccache != (ContextCache *)0) {
    contextsize = ccache->getDatabase()->getContextSize();
    context = new uintm[ contextsize ];
  }
  else {
    contextsize = 0;
    context = (uintm *)0;
  }
}